

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O1

ssize_t __thiscall
duckdb_httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  void *__n;
  undefined4 in_register_00000034;
  void *__buf_00;
  void *__n_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  __n = (void *)0x7fffffffffffffff;
  if (__buf < (void *)0x7fffffffffffffff) {
    __n = __buf;
  }
  uVar1 = this->read_buff_off_;
  __n_00 = (void *)(this->read_buff_content_size_ - uVar1);
  if (this->read_buff_content_size_ < uVar1 || __n_00 == (void *)0x0) {
    iVar3 = (*(this->super_Stream)._vptr_Stream[2])(this);
    __n_00 = (void *)0xffffffffffffffff;
    if ((char)iVar3 != '\0') {
      this->read_buff_off_ = 0;
      this->read_buff_content_size_ = 0;
      iVar3 = this->sock_;
      if (__buf < (void *)0x1000) {
        pcVar2 = (this->read_buff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          __n_00 = (void *)recv(iVar3,pcVar2,0x1000,0);
          if (-1 < (long)__n_00) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        if (0 < (long)__n_00) {
          pcVar2 = (this->read_buff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)__n < (long)__n_00) {
            switchD_01602a8a::default(__buf_00,pcVar2,(size_t)__n);
            this->read_buff_off_ = (size_t)__n;
            this->read_buff_content_size_ = (size_t)__n_00;
            __n_00 = __n;
          }
          else {
            switchD_01602a8a::default(__buf_00,pcVar2,(size_t)__n_00);
          }
        }
      }
      else {
        do {
          __n_00 = (void *)recv(iVar3,__buf_00,(size_t)__n,0);
          if (-1 < (long)__n_00) {
            return (ssize_t)__n_00;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
    }
  }
  else {
    if (__n < __n_00) {
      __n_00 = __n;
    }
    switchD_01602a8a::default
              (__buf_00,(this->read_buff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar1,(size_t)__n_00);
    this->read_buff_off_ = this->read_buff_off_ + (long)__n_00;
  }
  return (ssize_t)__n_00;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
#ifdef _WIN32
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#else
  size = (std::min)(size,
                    static_cast<size_t>((std::numeric_limits<ssize_t>::max)()));
#endif

  if (read_buff_off_ < read_buff_content_size_) {
    auto remaining_size = read_buff_content_size_ - read_buff_off_;
    if (size <= remaining_size) {
      memcpy(ptr, read_buff_.data() + read_buff_off_, size);
      read_buff_off_ += size;
      return static_cast<ssize_t>(size);
    } else {
      memcpy(ptr, read_buff_.data() + read_buff_off_, remaining_size);
      read_buff_off_ += remaining_size;
      return static_cast<ssize_t>(remaining_size);
    }
  }

  if (!is_readable()) { return -1; }

  read_buff_off_ = 0;
  read_buff_content_size_ = 0;

  if (size < read_buff_size_) {
    auto n = read_socket(sock_, read_buff_.data(), read_buff_size_,
                         CPPHTTPLIB_RECV_FLAGS);
    if (n <= 0) {
      return n;
    } else if (n <= static_cast<ssize_t>(size)) {
      memcpy(ptr, read_buff_.data(), static_cast<size_t>(n));
      return n;
    } else {
      memcpy(ptr, read_buff_.data(), size);
      read_buff_off_ = size;
      read_buff_content_size_ = static_cast<size_t>(n);
      return static_cast<ssize_t>(size);
    }
  } else {
    return read_socket(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS);
  }
}